

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc_sse2.c
# Opt level: O0

void aom_comp_avg_upsampled_pred_sse2
               (MACROBLOCKD *xd,AV1Common *cm,int mi_row,int mi_col,MV *mv,uint8_t *comp_pred,
               uint8_t *pred,int width,int height,int subpel_x_q3,int subpel_y_q3,uint8_t *ref,
               int ref_stride,int subpel_search)

{
  longlong in_RSI;
  void *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i alVar1;
  void *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  __m128i p0;
  __m128i s0;
  int i;
  int n;
  uint8_t *in_stack_000091c8;
  MV *in_stack_000091d0;
  int in_stack_000091d8;
  int in_stack_000091dc;
  AV1Common *in_stack_000091e0;
  MACROBLOCKD *in_stack_000091e8;
  int in_stack_000092a0;
  int in_stack_000092a8;
  int in_stack_000092b0;
  int in_stack_000092b8;
  uint8_t *in_stack_000092c0;
  int in_stack_000092c8;
  int in_stack_000092d0;
  undefined4 local_78;
  undefined8 local_70;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 local_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  
  aom_upsampled_pred_sse2
            (in_stack_000091e8,in_stack_000091e0,in_stack_000091dc,in_stack_000091d8,
             in_stack_000091d0,in_stack_000091c8,in_stack_000092a0,in_stack_000092a8,
             in_stack_000092b0,in_stack_000092b8,in_stack_000092c0,in_stack_000092c8,
             in_stack_000092d0);
  local_70 = in_R9;
  for (local_78 = 0; local_78 < in_stack_00000010 * in_stack_00000018 >> 4; local_78 = local_78 + 1)
  {
    xx_loadu_128(local_70);
    alVar1 = xx_loadu_128(in_stack_00000008);
    local_38 = (undefined1)extraout_XMM0_Qa;
    uStack_37 = (undefined1)((ulong)extraout_XMM0_Qa >> 8);
    uStack_36 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x10);
    uStack_35 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x18);
    uStack_34 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x20);
    uStack_33 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x28);
    uStack_32 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x30);
    uStack_31 = (undefined1)((ulong)extraout_XMM0_Qa >> 0x38);
    uStack_30 = (undefined1)extraout_XMM0_Qb;
    uStack_2f = (undefined1)((ulong)extraout_XMM0_Qb >> 8);
    uStack_2e = (undefined1)((ulong)extraout_XMM0_Qb >> 0x10);
    uStack_2d = (undefined1)((ulong)extraout_XMM0_Qb >> 0x18);
    uStack_2c = (undefined1)((ulong)extraout_XMM0_Qb >> 0x20);
    uStack_2b = (undefined1)((ulong)extraout_XMM0_Qb >> 0x28);
    uStack_2a = (undefined1)((ulong)extraout_XMM0_Qb >> 0x30);
    uStack_29 = (undefined1)((ulong)extraout_XMM0_Qb >> 0x38);
    local_48 = (undefined1)extraout_XMM0_Qa_00;
    uStack_47 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 8);
    uStack_46 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x10);
    uStack_45 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x18);
    uStack_44 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x20);
    uStack_43 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x28);
    uStack_42 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x30);
    uStack_41 = (undefined1)((ulong)extraout_XMM0_Qa_00 >> 0x38);
    uStack_40 = (undefined1)extraout_XMM0_Qb_00;
    uStack_3f = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 8);
    uStack_3e = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x10);
    uStack_3d = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x18);
    uStack_3c = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x20);
    uStack_3b = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x28);
    uStack_3a = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x30);
    uStack_39 = (undefined1)((ulong)extraout_XMM0_Qb_00 >> 0x38);
    pavgb(local_38,local_48);
    pavgb(uStack_37,uStack_47);
    pavgb(uStack_36,uStack_46);
    pavgb(uStack_35,uStack_45);
    pavgb(uStack_34,uStack_44);
    pavgb(uStack_33,uStack_43);
    pavgb(uStack_32,uStack_42);
    pavgb(uStack_31,uStack_41);
    pavgb(uStack_30,uStack_40);
    pavgb(uStack_2f,uStack_3f);
    pavgb(uStack_2e,uStack_3e);
    pavgb(uStack_2d,uStack_3d);
    pavgb(uStack_2c,uStack_3c);
    pavgb(uStack_2b,uStack_3b);
    pavgb(uStack_2a,uStack_3a);
    pavgb(uStack_29,uStack_39);
    alVar1[0] = in_RSI;
    xx_storeu_128(local_70,alVar1);
    local_70 = (void *)((long)local_70 + 0x10);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + 0x10);
  }
  return;
}

Assistant:

void aom_comp_avg_upsampled_pred_sse2(
    MACROBLOCKD *xd, const struct AV1Common *const cm, int mi_row, int mi_col,
    const MV *const mv, uint8_t *comp_pred, const uint8_t *pred, int width,
    int height, int subpel_x_q3, int subpel_y_q3, const uint8_t *ref,
    int ref_stride, int subpel_search) {
  int n;
  int i;
  aom_upsampled_pred(xd, cm, mi_row, mi_col, mv, comp_pred, width, height,
                     subpel_x_q3, subpel_y_q3, ref, ref_stride, subpel_search);
  /*The total number of pixels must be a multiple of 16 (e.g., 4x4).*/
  assert(!(width * height & 15));
  n = width * height >> 4;
  for (i = 0; i < n; i++) {
    __m128i s0 = xx_loadu_128(comp_pred);
    __m128i p0 = xx_loadu_128(pred);
    xx_storeu_128(comp_pred, _mm_avg_epu8(s0, p0));
    comp_pred += 16;
    pred += 16;
  }
}